

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void mbedtls_debug_print_buf
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,uchar *buf,
               size_t len)

{
  uchar uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char txt [17];
  char str [512];
  uchar local_258 [24];
  ulong local_240;
  char local_238 [520];
  
  if (((ssl->conf != (mbedtls_ssl_config *)0x0) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    snprintf(local_238,0x200,"dumping \'%s\' (%u bytes)\n",text,len & 0xffffffff);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
    local_258[0] = '\0';
    local_258[1] = '\0';
    local_258[2] = '\0';
    local_258[3] = '\0';
    local_258[4] = '\0';
    local_258[5] = '\0';
    local_258[6] = '\0';
    local_258[7] = '\0';
    local_258[8] = '\0';
    local_258[9] = '\0';
    local_258[10] = '\0';
    local_258[0xb] = '\0';
    local_258[0xc] = '\0';
    local_258[0xd] = '\0';
    local_258[0xe] = '\0';
    local_258[0xf] = '\0';
    local_258[0x10] = 0;
    if (len != 0) {
      uVar4 = 0xfff;
      if (len - 1 < 0xfff) {
        uVar4 = len - 1;
      }
      local_240 = uVar4 + 1;
      lVar5 = 0;
      uVar3 = 0;
      do {
        if ((uVar3 & 0xf) == 0) {
          if (uVar3 != 0) {
            snprintf(local_238 + lVar5,0x200 - lVar5,"  %s\n",local_258);
            (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
            local_258[0] = '\0';
            local_258[1] = '\0';
            local_258[2] = '\0';
            local_258[3] = '\0';
            local_258[4] = '\0';
            local_258[5] = '\0';
            local_258[6] = '\0';
            local_258[7] = '\0';
            local_258[8] = '\0';
            local_258[9] = '\0';
            local_258[10] = '\0';
            local_258[0xb] = '\0';
            local_258[0xc] = '\0';
            local_258[0xd] = '\0';
            local_258[0xe] = '\0';
            local_258[0xf] = '\0';
            local_258[0x10] = 0;
            lVar5 = 0;
          }
          iVar2 = snprintf(local_238 + lVar5,0x200 - lVar5,"%04x: ",uVar3 & 0xffffffff);
          lVar5 = lVar5 + iVar2;
        }
        iVar2 = snprintf(local_238 + lVar5,0x200 - lVar5," %02x",(ulong)buf[uVar3]);
        lVar5 = iVar2 + lVar5;
        uVar1 = buf[uVar3];
        if (0x5e < (byte)(buf[uVar3] - 0x20)) {
          uVar1 = '.';
        }
        local_258[uVar3 & 0xf] = uVar1;
        uVar3 = uVar3 + 1;
      } while (local_240 != uVar3);
      if (len != 0) {
        if ((local_240 & 0xf) != 0) {
          uVar4 = uVar4 + 2;
          do {
            iVar2 = snprintf(local_238 + lVar5,0x200 - lVar5,"   ");
            lVar5 = lVar5 + iVar2;
            uVar3 = uVar4 & 0xf;
            uVar4 = uVar4 + 1;
          } while (uVar3 != 0);
        }
        snprintf(local_238 + lVar5,0x200 - lVar5,"  %s\n",local_258);
        (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
      }
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_buf( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line, const char *text,
                      const unsigned char *buf, size_t len )
{
    char str[DEBUG_BUF_SIZE];
    char txt[17];
    size_t i, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "dumping '%s' (%u bytes)\n",
              text, (unsigned int) len );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    memset( txt, 0, sizeof( txt ) );
    for( i = 0; i < len; i++ )
    {
        if( i >= 4096 )
            break;

        if( i % 16 == 0 )
        {
            if( i > 0 )
            {
                mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
                debug_send_line( ssl, level, file, line, str );

                idx = 0;
                memset( txt, 0, sizeof( txt ) );
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "%04x: ",
                             (unsigned int) i );

        }

        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x",
                         (unsigned int) buf[i] );
        txt[i % 16] = ( buf[i] > 31 && buf[i] < 127 ) ? buf[i] : '.' ;
    }

    if( len > 0 )
    {
        for( /* i = i */; i % 16 != 0; i++ )
            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "   " );

        mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
        debug_send_line( ssl, level, file, line, str );
    }
}